

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

bool __thiscall chatra::Thread::assignmentOperator(Thread *this)

{
  pointer *ppuVar1;
  Frame *this_00;
  pointer *pppVar2;
  Type TVar3;
  int iVar4;
  pointer pFVar5;
  Node *pNVar6;
  pointer ppTVar7;
  Tuple *pTVar8;
  Object *pOVar9;
  TemporaryObject *pTVar10;
  iterator __position;
  long *plVar11;
  size_t *psVar12;
  size_t position;
  pointer pcVar13;
  bool bVar14;
  EvaluateValueResult EVar15;
  long lVar16;
  Key *pKVar17;
  const_iterator cVar18;
  Method *pMVar19;
  Class *pCVar20;
  pointer pRVar21;
  Reference *pRVar22;
  TemporaryObject *pTVar23;
  undefined8 *puVar24;
  Reference RVar25;
  Array *this_01;
  pointer pbVar26;
  unsigned_long uVar27;
  undefined1 auVar28 [8];
  unsigned_long *puVar29;
  pointer pbVar30;
  pointer puVar31;
  pointer pRVar32;
  ulong uVar33;
  ReferenceNode *pRVar34;
  pointer_____offset_0x10___ *ppuVar35;
  ulong uVar36;
  pointer puVar37;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_02;
  const_iterator __end5;
  long *plVar38;
  size_t *psVar39;
  ulong uVar40;
  iterator __beg;
  ArgumentSpec arg;
  ArgumentSpec arg_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  unsigned_long local_1e0;
  size_t destIndex;
  TemporaryTuple *local_1d0;
  string local_1c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  undefined1 local_190 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> srcIndexes;
  undefined1 auStack_168 [8];
  vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
  map;
  long local_148;
  Element local_140;
  char local_108;
  char local_107;
  _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_unsigned_long>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_100;
  Type local_c4;
  undefined1 local_c0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> destIndexes;
  Reference ref;
  Reference RStack_88;
  Reference srcRef;
  ReferenceNode *local_60;
  size_t srcIndex;
  vector<unsigned_long,_std::allocator<unsigned_long>_> empty;
  
  pFVar5 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pFVar5 + -1;
  empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)pFVar5[-1].stack.
                super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  pNVar6 = ((pointer)
           ((long)empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + -0x10))->first;
  uVar36 = ((pointer)
           ((long)empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + -0x10))->second;
  if (0x14 < uVar36) {
    if (uVar36 == 0x1e) {
      pFVar5[-1].stack.
      super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((long)empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + -0x10);
LAB_0015f961:
      methodCallViaFunctionObject(this,true,(Method *)0x0);
      return false;
    }
switchD_0015f93a_caseD_4:
    if (0x27 < uVar36) {
      ppTVar7 = pFVar5[-1].values.
                super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar27 = pFVar5[-1].subStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1];
      local_1d0 = (TemporaryTuple *)((ppTVar7[uVar27 - 2]->targetRef).node)->object;
      pTVar8 = (Tuple *)((ppTVar7[uVar27 - 1]->targetRef).node)->object;
      srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ppTVar7[uVar27]->targetRef).node)->object;
      uVar40 = uVar36 - 0x28;
      uVar33 = uVar40 >> 2;
      switch((uint)uVar36 & 3) {
      case 1:
        goto switchD_0015f9f9_caseD_1;
      case 2:
        goto switchD_0015f9f9_caseD_2;
      case 3:
        goto switchD_0015f9f9_caseD_3;
      }
      do {
        uVar27 = srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage[0x16];
        uVar36 = ((long)(srcIndexes.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[0x17] - uVar27) >> 3) *
                 -0x3333333333333333;
        if (uVar36 < uVar33 || uVar36 - uVar33 == 0) {
          Frame::popTemporaryTuple(this_00);
          Frame::pop(this_00);
          Frame::pop(this_00);
          Frame::pop(this_00);
          pTVar23 = Frame::pushTemporary(this_00);
          RVar25 = TemporaryObject::setRvalue(pTVar23);
          (RVar25.node)->type = Object;
          (RVar25.node)->object = (Object *)0x0;
          pppVar2 = &pFVar5[-1].stack.
                     super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar2 = *pppVar2 + -1;
          ppuVar1 = &pFVar5[-1].subStack.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + -1;
          return true;
        }
        TemporaryTuple::extract(local_1d0,*(size_t *)(uVar27 + uVar33 * 0x28));
        iVar4 = *(int *)(uVar27 + 0x20 + uVar33 * 0x28);
        if (iVar4 == 3) {
          pCVar20 = Dict::getClassStatic();
LAB_00160736:
          if (pCVar20 != (Class *)0x0) {
            arg_00.cl = pCVar20;
            arg_00._0_8_ = 0xffffffff;
            TemporaryObject::addAssignment
                      (pFVar5[-1].values.
                       super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1],pNVar6,arg_00);
          }
        }
        else {
          if (iVar4 == 1) {
            pCVar20 = Array::getClassStatic();
            goto LAB_00160736;
          }
          lVar16 = uVar27 + uVar33 * 0x28;
          plVar38 = *(long **)(lVar16 + 8);
          if (plVar38 != *(long **)(lVar16 + 0x10)) {
            pCVar20 = getReferClass((pTVar8->super_ObjectBase).super_Object.refsArray.
                                    super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                                    ._M_impl.super__Vector_impl_data._M_start[*plVar38].node);
            goto LAB_00160736;
          }
        }
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[-1] =
             empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage[-1] + 1;
switchD_0015f9f9_caseD_1:
        EVar15 = evaluateAndAllocateForAssignment
                           (this,(((pNVar6->subNodes).
                                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr,
                            pFVar5[-1].values.
                            super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1]);
        if (EVar15 != Next) {
          return false;
        }
switchD_0015f9f9_caseD_2:
        pTVar23 = pFVar5[-1].values.
                  super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1];
        TVar3 = pTVar23->type;
        if ((1 < TVar3 - ScopeRef) &&
           ((1 < TVar3 - FrameMethod ||
            (pMVar19 = TemporaryObject::getSetMethod(pTVar23), pMVar19 == (Method *)0x0)))) {
          pNVar6 = (((pNVar6->subNodes).
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          map.
          super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_140;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &map.
                      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "expression is not assignable","");
          srcIndex = 0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          errorAtNode(&this->super_IErrorReceiver,Error,pNVar6,
                      (string *)
                      &map.
                       super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&srcIndex);
          goto LAB_00160623;
        }
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[-1] =
             empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage[-1] + 1;
switchD_0015f9f9_caseD_3:
        lVar16 = srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage[0x16] + uVar33 * 0x28;
        pTVar23 = Frame::pushTemporary(this_00);
        RStack_88 = TemporaryObject::setRvalue(pTVar23);
        if (*(int *)(lVar16 + 0x20) == 3) {
          destIndex = (size_t)Reference::allocateWithoutLock<chatra::Dict>(&RStack_88);
          psVar12 = *(size_t **)(lVar16 + 0x10);
          for (psVar39 = *(size_t **)(lVar16 + 8); psVar39 != psVar12; psVar39 = psVar39 + 1) {
            position = *psVar39;
            pKVar17 = Tuple::key(pTVar8,position);
            uVar36 = (ulong)pKVar17->sid;
            if (uVar36 == 0xffffffff) {
              pbVar30 = &pKVar17->str;
              pbVar26 = &pKVar17->str;
            }
            else {
              pbVar26 = (this->sTable->idToStr).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pbVar30 = pbVar26 + uVar36;
              pbVar26 = pbVar26 + uVar36;
            }
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            pcVar13 = (pbVar30->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c8,pcVar13,pcVar13 + pbVar26->_M_string_length);
            Dict::add((Dict *)destIndex,&local_1c8,
                      (pTVar8->super_ObjectBase).super_Object.refsArray.
                      super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                      _M_impl.super__Vector_impl_data._M_start[position].node);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p);
            }
          }
        }
        else if (*(int *)(lVar16 + 0x20) == 1) {
          this_01 = Reference::allocateWithoutLock<chatra::Array>(&RStack_88);
          plVar11 = *(long **)(lVar16 + 0x10);
          for (plVar38 = *(long **)(lVar16 + 8); plVar38 != plVar11; plVar38 = plVar38 + 1) {
            Array::add(this_01,(pTVar8->super_ObjectBase).super_Object.refsArray.
                               super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                               ._M_impl.super__Vector_impl_data._M_start[*plVar38].node);
          }
        }
        else if (*(long **)(lVar16 + 8) == *(long **)(lVar16 + 0x10)) {
          (RStack_88.node)->type = Object;
          (RStack_88.node)->object = (Object *)0x0;
        }
        else {
          map.
          super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(pTVar8->super_ObjectBase).super_Object.refsArray.
                        super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                        _M_impl.super__Vector_impl_data._M_start[**(long **)(lVar16 + 8)].node;
          Reference::setWithoutBothLock
                    (&RStack_88,
                     (Reference *)
                     &map.
                      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        pTVar23 = pFVar5[-1].values.
                  super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-2];
        bVar14 = TemporaryObject::hasRef(pTVar23);
        if (!bVar14) {
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[-1] = (uVar40 & 0xfffffffffffffffc) + 0x2c;
          goto LAB_0016069e;
        }
        bVar14 = lockReference(this,pTVar23);
        if (!bVar14) {
          return false;
        }
        destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(pTVar23->targetRef).node;
        if (((ReferenceNode *)
            destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage)->group->isConst == true) {
          pNVar6 = (((pNVar6->subNodes).
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          map.
          super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_140;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &map.
                      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "cannot modify constant reference","");
          srcIndex = 0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          errorAtNode(&this->super_IErrorReceiver,Error,pNVar6,
                      (string *)
                      &map.
                       super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&srcIndex);
          goto LAB_00160623;
        }
        if ((pTVar23->hasArgs == true) &&
           (pCVar20 = getReferClass((Reference)
                                    destIndexes.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage),
           pCVar20 == (Class *)PreDefined<chatra::FunctionObject,(chatra::StringId)159>::pdCl)) {
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[-1] = (uVar40 & 0xfffffffffffffffc) + 0x2c;
          goto LAB_0015f961;
        }
        Reference::setWithoutBothLock
                  ((Reference *)
                   &destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&RStack_88);
        Frame::pop(this_00);
        Frame::pop(this_00);
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[-1] = (uVar40 & 0xfffffffffffffffc) + 0x2c;
        uVar40 = (uVar40 & 0xfffffffffffffffc) + 4;
        uVar33 = uVar40 >> 2;
      } while( true );
    }
    puVar24 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar24 = &PTR__exception_00243be0;
    ppuVar35 = &InternalError::typeinfo;
    goto LAB_00160614;
  }
  switch(uVar36) {
  case 0:
    ((pointer)
    ((long)empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + -0x10))->second = 1;
    map.
    super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(((pNVar6->subNodes).
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    goto LAB_0015ff07;
  case 1:
    ((pointer)
    ((long)empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + -0x10))->second = 2;
    map.
    super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(pNVar6->subNodes).
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].
                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_0015ff07:
    srcIndex = srcIndex & 0xffffffff00000000;
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,int>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)&pFVar5[-1].stack,
               (Node **)&map.
                         super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(int *)&srcIndex);
    return true;
  case 2:
    break;
  case 3:
    goto switchD_0015f93a_caseD_3;
  default:
    goto switchD_0015f93a_caseD_4;
  case 6:
    goto switchD_0015f93a_caseD_6;
  case 7:
    goto switchD_0015f93a_caseD_7;
  case 8:
    goto switchD_0015f93a_caseD_8;
  case 10:
    ppTVar7 = pFVar5[-1].values.
              super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pTVar23 = ppTVar7[-2];
    pTVar10 = ppTVar7[-1];
    bVar14 = lockReference(this,pTVar23);
    if (!bVar14) {
      return false;
    }
    RStack_88.node = (pTVar23->targetRef).node;
    if ((RStack_88.node)->group->isConst != true) {
      if ((pTVar23->hasArgs == true) &&
         (pCVar20 = getReferClass(RStack_88),
         pCVar20 == (Class *)PreDefined<chatra::FunctionObject,(chatra::StringId)159>::pdCl)) {
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[-1] = 0x1e;
        return true;
      }
      map.
      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pTVar10->targetRef).node;
      Reference::setWithoutBothLock
                (&RStack_88,
                 (Reference *)
                 &map.
                  super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Frame::pop(this_00);
      pppVar2 = &pFVar5[-1].stack.
                 super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar2 = *pppVar2 + -1;
      return true;
    }
    pNVar6 = (((pNVar6->subNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    map.
    super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &map.
                super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "cannot modify constant reference","");
    srcIndex = 0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errorAtNode(&this->super_IErrorReceiver,Error,pNVar6,
                (string *)
                &map.
                 super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&srcIndex);
    goto LAB_00160623;
  case 0x14:
    pFVar5[-1].stack.
    super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((long)empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + -0x10);
LAB_0016069e:
    methodCall(this,true);
    return false;
  }
  EVar15 = evaluateValue(this,Value);
  if (EVar15 == Suspend) {
    return false;
  }
  if (EVar15 == StackChanged) {
    return true;
  }
switchD_0015f93a_caseD_3:
  empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[-1] = 6;
switchD_0015f93a_caseD_6:
  ppTVar7 = pFVar5[-1].values.
            super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pTVar23 = ppTVar7[-2];
  pTVar10 = ppTVar7[-1];
  if (pTVar23->type == Rvalue) {
    pCVar20 = getReferClass((pTVar23->targetRef).node);
    bVar14 = pCVar20 == (Class *)PreDefined<chatra::TemporaryTuple,(chatra::StringId)157>::pdCl;
  }
  else {
    bVar14 = false;
  }
  pCVar20 = getReferClass((pTVar10->targetRef).node);
  if ((bVar14) || (pCVar20 != (Class *)PreDefined<chatra::Tuple,(chatra::StringId)156>::pdCl)) {
    if (bVar14) {
      if (pCVar20 != (Class *)PreDefined<chatra::Tuple,(chatra::StringId)156>::pdCl) {
        map.
        super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_140;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &map.
                    super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"right side is not tuple","")
        ;
        srcIndex = 0;
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        errorAtNode(&this->super_IErrorReceiver,Error,pNVar6,
                    (string *)
                    &map.
                     super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&srcIndex);
        goto LAB_00160623;
      }
      auStack_168 = (undefined1  [8])0x0;
      map.
      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      map.
      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      TemporaryTuple::toArgumentMatcher
                ((ArgumentMatcher *)
                 &map.
                  super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (TemporaryTuple *)((pTVar23->targetRef).node)->object);
      pTVar8 = (Tuple *)((pTVar10->targetRef).node)->object;
      RStack_88.node = (ReferenceNode *)0x0;
      srcRef.node = (ReferenceNode *)0x0;
      destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ref.node = (ReferenceNode *)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190,
                 (long)(pTVar8->super_ObjectBase).super_Object.refsArray.
                       super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pTVar8->super_ObjectBase).super_Object.refsArray.
                       super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&srcIndex);
      lVar16 = (long)(pTVar8->super_ObjectBase).super_Object.refsArray.
                     super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pTVar8->super_ObjectBase).super_Object.refsArray.
                     super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar16 != 0) {
        lVar16 = lVar16 >> 3;
        uVar27 = 0;
        do {
          *(unsigned_long *)((long)local_190 + uVar27 * 8) = uVar27;
          uVar27 = uVar27 + 1;
        } while (lVar16 + (ulong)(lVar16 == 0) != uVar27);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,
                 (local_148 -
                  (long)map.
                        super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                 -0x5555555555555555,(allocator_type *)&srcIndex);
      if (local_148 -
          (long)map.
                super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
        lVar16 = (local_148 -
                  (long)map.
                        super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                 -0x5555555555555555;
        uVar27 = 0;
        do {
          *(unsigned_long *)((long)local_c0 + uVar27 * 8) = uVar27;
          uVar27 = uVar27 + 1;
        } while (lVar16 + (ulong)(lVar16 == 0) != uVar27);
      }
      if (local_108 != '\0') {
        *(unsigned_long *)((long)local_c0 + local_140._32_8_ * 8) = 0xffffffffffffffff;
      }
      if (local_107 == '\x01') {
        destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[-1] = 0xffffffffffffffff;
      }
      pRVar21 = (pTVar8->super_ObjectBase).super_Object.refsArray.
                super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pRVar32 = pRVar21;
      if (pRVar21 !=
          (pTVar8->super_ObjectBase).super_Object.refsArray.
          super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pRVar34 = (ReferenceNode *)0x0;
        do {
          pKVar17 = Tuple::key(pTVar8,(size_t)pRVar34);
          if ((pKVar17->sid != Invalid) &&
             (cVar18 = std::
                       _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_unsigned_long>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(&local_100,&pKVar17->sid),
             cVar18.
             super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>.
             _M_cur != (__node_type *)0x0)) {
            srcIndex = *(size_t *)
                        ((long)cVar18.
                               super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                               ._M_cur + 0x10);
            local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)pRVar34;
            std::
            vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
            ::emplace_back<unsigned_long&,unsigned_long&,chatra::ArgumentDef::Type_const&>
                      ((vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
                        *)auStack_168,&srcIndex,(unsigned_long *)&local_1a8,
                       (Type *)(&(map.
                                  super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->destIndex +
                               srcIndex * 3));
            *(unsigned_long *)((long)local_190 + pRVar34 * 8) = 0xffffffffffffffff;
            *(unsigned_long *)
             ((long)local_c0 +
             *(long *)((long)cVar18.
                             super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                             ._M_cur + 0x10) * 8) = 0xffffffffffffffff;
          }
          pRVar34 = (ReferenceNode *)((long)&pRVar34->group + 1);
          pRVar21 = (pTVar8->super_ObjectBase).super_Object.refsArray.
                    super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pRVar32 = (pTVar8->super_ObjectBase).super_Object.refsArray.
                    super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        } while (pRVar34 < (ReferenceNode *)((long)pRVar32 - (long)pRVar21 >> 3));
      }
      local_60 = (ReferenceNode *)0x0;
      if (local_140._32_8_ == 0) {
        pRVar34 = (ReferenceNode *)0x0;
      }
      else {
        pRVar34 = (ReferenceNode *)0x0;
        uVar40 = 0;
        auVar28 = local_c0;
        uVar36 = local_140._32_8_;
        do {
          if (*(pointer)((long)auVar28 + uVar40 * 8) != 0xffffffffffffffff) {
            puVar31 = (pointer)((long)local_190 + pRVar34 * 8);
            uVar36 = (long)srcIndexes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start - (long)puVar31;
            if (0 < (long)uVar36 >> 5) {
              puVar31 = (pointer)((long)puVar31 + (uVar36 & 0xffffffffffffffe0));
              lVar16 = ((long)uVar36 >> 5) + 1;
              puVar37 = (pointer)((long)local_190 +
                                 (byte *)((long)&(((Lockable *)&pRVar34->group)->lockRequester)._M_i
                                         + 2) * 8);
              do {
                if (puVar37[-2] != 0xffffffffffffffff) {
                  puVar37 = puVar37 + -2;
                  goto LAB_0015fdda;
                }
                if (puVar37[-1] != 0xffffffffffffffff) {
                  puVar37 = puVar37 + -1;
                  goto LAB_0015fdda;
                }
                if (*puVar37 != 0xffffffffffffffff) goto LAB_0015fdda;
                if (puVar37[1] != 0xffffffffffffffff) {
                  puVar37 = puVar37 + 1;
                  goto LAB_0015fdda;
                }
                lVar16 = lVar16 + -1;
                puVar37 = puVar37 + 4;
              } while (1 < lVar16);
              uVar36 = (long)srcIndexes.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start - (long)puVar31;
            }
            lVar16 = (long)uVar36 >> 3;
            if (lVar16 == 1) {
LAB_0015fdbd:
              puVar37 = puVar31;
              if (*puVar31 == 0xffffffffffffffff) {
                puVar37 = srcIndexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
            }
            else if (lVar16 == 2) {
LAB_0015fdb3:
              puVar37 = puVar31;
              if (*puVar31 == 0xffffffffffffffff) {
                puVar31 = puVar31 + 1;
                goto LAB_0015fdbd;
              }
            }
            else {
              if (lVar16 != 3) break;
              puVar37 = puVar31;
              if (*puVar31 == 0xffffffffffffffff) {
                puVar31 = puVar31 + 1;
                goto LAB_0015fdb3;
              }
            }
LAB_0015fdda:
            if (puVar37 ==
                srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start) break;
            local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)((long)puVar37 - (long)local_190 >> 3);
            local_60 = (ReferenceNode *)
                       local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            srcIndex = uVar40;
            std::
            vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
            ::emplace_back<unsigned_long&,unsigned_long&,chatra::ArgumentDef::Type_const&>
                      ((vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
                        *)auStack_168,&srcIndex,(unsigned_long *)&local_1a8,
                       (Type *)(&(map.
                                  super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->destIndex +
                               uVar40 * 3));
            *(unsigned_long *)((long)local_190 + local_60 * 8) = 0xffffffffffffffff;
            *(unsigned_long *)((long)local_c0 + uVar40 * 8) = 0xffffffffffffffff;
            pRVar34 = (ReferenceNode *)((long)&local_60->group + 1);
            auVar28 = local_c0;
            uVar36 = local_140._32_8_;
            local_60 = pRVar34;
          }
          uVar40 = uVar40 + 1;
        } while (uVar40 < uVar36);
        pRVar21 = (pTVar8->super_ObjectBase).super_Object.refsArray.
                  super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pRVar32 = (pTVar8->super_ObjectBase).super_Object.refsArray.
                  super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      if (pRVar34 < (ReferenceNode *)((long)pRVar32 - (long)pRVar21 >> 3)) {
        do {
          if (*(pointer)((long)local_190 + pRVar34 * 8) != 0xffffffffffffffff) {
            pKVar17 = Tuple::key(pTVar8,(size_t)pRVar34);
            if ((pKVar17->sid == Invalid) || (local_107 != '\x01')) {
              if (local_108 == '\x01') {
                this_02 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&RStack_88;
                if (srcRef.node == (ReferenceNode *)0x0) goto LAB_00160049;
                (srcRef.node)->group = (ReferenceGroup *)local_60;
                pRVar22 = &srcRef;
                RVar25 = srcRef;
                goto LAB_00160034;
              }
            }
            else if (ref.node == (ReferenceNode *)0x0) {
              this_02 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                        &destIndexes.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
LAB_00160049:
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long&>(this_02,(iterator)0x0,(unsigned_long *)&local_60);
            }
            else {
              (ref.node)->group = (ReferenceGroup *)local_60;
              pRVar22 = &ref;
              RVar25 = ref;
LAB_00160034:
              pRVar22->node = (ReferenceNode *)&(RVar25.node)->type;
            }
          }
          pRVar34 = (ReferenceNode *)
                    ((long)&(((Lockable *)&local_60->group)->lockRequester)._M_i + 1);
          local_60 = pRVar34;
        } while (pRVar34 < (ReferenceNode *)
                           ((long)(pTVar8->super_ObjectBase).super_Object.refsArray.
                                  super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar8->super_ObjectBase).super_Object.refsArray.
                                  super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (local_108 == '\x01') {
        local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)RStack_88.node;
        local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)srcRef.node;
        local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        RStack_88.node = (ReferenceNode *)0x0;
        srcRef.node = (ReferenceNode *)0x0;
        srcIndex = local_140._32_8_;
        std::
        vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
        ::
        emplace_back<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>,chatra::ArgumentDef::Type_const&>
                  ((vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
                    *)auStack_168,&srcIndex,&local_1a8,
                   (Type *)(&(map.
                              super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->destIndex +
                           local_140._32_8_ * 3));
        if ((ReferenceNode *)
            local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (ReferenceNode *)0x0) {
          operator_delete(local_1a8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (local_107 == '\x01') {
        srcIndex = (local_148 -
                    (long)map.
                          super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                   -0x5555555555555555 - 1;
        local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)ref.node;
        local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ref.node = (ReferenceNode *)0x0;
        std::
        vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
        ::
        emplace_back<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>,chatra::ArgumentDef::Type_const&>
                  ((vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
                    *)auStack_168,&srcIndex,&local_1f8,(Type *)(local_148 + -0x18));
        if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      uVar36 = (long)destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start - (long)local_c0;
      auVar28 = local_c0;
      if (0 < (long)uVar36 >> 5) {
        auVar28 = (undefined1  [8])((uVar36 & 0xffffffffffffffe0) + (long)local_c0);
        lVar16 = ((long)uVar36 >> 5) + 1;
        puVar31 = (pointer)((long)local_c0 + 0x10);
        do {
          if (puVar31[-2] == 0xffffffffffffffff) {
            puVar31 = puVar31 + -2;
            goto LAB_00160227;
          }
          if (puVar31[-1] == 0xffffffffffffffff) {
            puVar31 = puVar31 + -1;
            goto LAB_00160227;
          }
          if (*puVar31 == 0xffffffffffffffff) goto LAB_00160227;
          if (puVar31[1] == 0xffffffffffffffff) {
            puVar31 = puVar31 + 1;
            goto LAB_00160227;
          }
          lVar16 = lVar16 + -1;
          puVar31 = puVar31 + 4;
        } while (1 < lVar16);
        uVar36 = (long)destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auVar28;
      }
      lVar16 = (long)uVar36 >> 3;
      if (lVar16 == 1) {
LAB_001601f9:
        puVar31 = (pointer)auVar28;
        if (*(unsigned_long *)auVar28 != 0xffffffffffffffff) {
          puVar31 = destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
      }
      else if (lVar16 == 2) {
LAB_001601ef:
        puVar31 = (pointer)auVar28;
        if (*(unsigned_long *)auVar28 != 0xffffffffffffffff) {
          auVar28 = (undefined1  [8])((long)auVar28 + 8);
          goto LAB_001601f9;
        }
      }
      else {
        if (lVar16 != 3) goto LAB_00160265;
        puVar31 = (pointer)auVar28;
        if (*(unsigned_long *)auVar28 != 0xffffffffffffffff) {
          auVar28 = (undefined1  [8])((long)auVar28 + 8);
          goto LAB_001601ef;
        }
      }
LAB_00160227:
      puVar29 = puVar31 + 1;
      if (puVar29 !=
          destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start &&
          puVar31 !=
          destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          if (*puVar29 != 0xffffffffffffffff) {
            *puVar31 = *puVar29;
            puVar31 = puVar31 + 1;
          }
          puVar29 = puVar29 + 1;
        } while (puVar29 !=
                 destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      }
      if (puVar31 !=
          destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar31;
      }
LAB_00160265:
      puVar31 = destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (local_c0 !=
          (undefined1  [8])
          destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        srcIndex = 0;
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        auVar28 = local_c0;
        do {
          local_1e0 = *(unsigned_long *)auVar28;
          local_c4 = List;
          std::
          vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
          ::
          emplace_back<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,chatra::ArgumentDef::Type>
                    ((vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
                      *)auStack_168,&local_1e0,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&srcIndex,&local_c4);
          auVar28 = (undefined1  [8])((long)auVar28 + 8);
        } while (auVar28 != (undefined1  [8])puVar31);
        if (srcIndex != 0) {
          operator_delete((void *)srcIndex);
        }
      }
      if (local_c0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_c0);
      }
      if (local_190 != (undefined1  [8])0x0) {
        operator_delete((void *)local_190);
      }
      if (destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(destIndexes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      if (RStack_88.node != (ReferenceNode *)0x0) {
        operator_delete(RStack_88.node);
      }
      std::
      _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_unsigned_long>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_100);
      if (local_140.sourceIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_140.sourceIndexes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (map.
          super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(map.
                        super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      map.
      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)pFVar5[-1].values.
                           super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)pFVar5[-1].values.
                           super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
      __position._M_current =
           pFVar5[-1].subStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          pFVar5[-1].subStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&pFVar5[-1].subStack,__position,
                   (unsigned_long *)
                   &map.
                    super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        *__position._M_current =
             (unsigned_long)
             map.
             super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pFVar5[-1].subStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pTVar23 = Frame::pushTemporary(this_00);
      map.
      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)TemporaryObject::setRvalue(pTVar23);
      Reference::
      allocateWithoutLock<chatra::TupleAssignmentMap,std::vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>>
                ((Reference *)
                 &map.
                  super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                  *)auStack_168);
      empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[-1] = 0x28;
      std::
      vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ::~vector((vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                 *)auStack_168);
      return true;
    }
LAB_0015fe61:
    pCVar20 = getReferClass((pTVar10->targetRef).node);
    arg.cl = pCVar20;
    arg._0_8_ = 0xffffffff;
    TemporaryObject::addAssignment(pTVar23,pNVar6,arg);
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[-1] =
         empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage[-1] + 1;
switchD_0015f93a_caseD_7:
    EVar15 = evaluateAndAllocateForAssignment
                       (this,(((pNVar6->subNodes).
                               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                        pFVar5[-1].values.
                        super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-2]);
    if (EVar15 != Next) {
      return false;
    }
switchD_0015f93a_caseD_8:
    pTVar23 = pFVar5[-1].values.
              super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish[-2];
    TVar3 = pTVar23->type;
    uVar27 = 10;
    if (TVar3 - ScopeRef < 2) {
LAB_0015fee6:
      empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[-1] = uVar27;
      return true;
    }
    if (TVar3 - FrameMethod < 2) {
      pMVar19 = TemporaryObject::getSetMethod(pTVar23);
      uVar27 = 0x14;
      if (pMVar19 != (Method *)0x0) goto LAB_0015fee6;
    }
    pNVar6 = (((pNVar6->subNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    map.
    super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &map.
                super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"expression is not assignable",""
              );
    srcIndex = 0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errorAtNode(&this->super_IErrorReceiver,Error,pNVar6,
                (string *)
                &map.
                 super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&srcIndex);
  }
  else {
    map.
    super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pTVar10->targetRef).node;
    pOVar9 = (Object *)
             ((map.
               super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->sourceIndexes).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pRVar21 = (pOVar9->refsArray).
              super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)(pOVar9->refsArray).
              super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pRVar21 == 8) {
      srcIndex = (size_t)pRVar21->node;
      Reference::setWithoutBothLock
                ((Reference *)
                 &map.
                  super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Reference *)&srcIndex);
      goto LAB_0015fe61;
    }
    map.
    super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &map.
                super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "left side is not tuple even through value of right side is tuple","");
    srcIndex = 0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errorAtNode(&this->super_IErrorReceiver,Error,pNVar6,
                (string *)
                &map.
                 super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&srcIndex);
  }
LAB_00160623:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&srcIndex);
  std::__cxx11::string::~string
            ((string *)
             &map.
              super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  puVar24 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar24 = &PTR__exception_00243b18;
  *(undefined4 *)(puVar24 + 1) = 0x83;
  ppuVar35 = &RuntimeException::typeinfo;
LAB_00160614:
  __cxa_throw(puVar24,ppuVar35,std::exception::~exception);
}

Assistant:

bool Thread::assignmentOperator() {
	auto& f = frames.back();
	auto* node = f.stack.back().first;
	auto& nodePhase = f.stack.back().second;

	constexpr size_t phaseReference = 10;
	constexpr size_t phaseMethod = 20;
	constexpr size_t phaseFunctionObject = 30;
	constexpr size_t phaseTuple = 40;

	switch (nodePhase) {
	case 0:  nodePhase++;  f.stack.emplace_back(node->subNodes[0].get(), 0);  return true;
	case 1:  nodePhase++;  f.stack.emplace_back(node->subNodes[1].get(), 0);  return true;
	case assignmentOperatorEvaluationPhase:  CHATRA_EVALUATE_VALUE;
	case assignmentOperatorEvaluationPhase + 1:  nodePhase = assignmentOperatorProcessPhase;  CHATRA_FALLTHROUGH;
	case assignmentOperatorProcessPhase: {
		// Note that node->subNode[1] cannot be accessed under specific situation
		// because following logic is also used by unaryAssignmentOperator().
		auto* v0 = *(f.values.end() - 2);
		auto* v1 = *(f.values.end() - 1);

		// Tuple <- Tuple: accept
		// Scalar <- Tuple: accept only if Tuple contains a single value
		// Tuple <- Scalar: reject
		// Scaler <- Scalar: accept

		bool v0IsTuple = (v0->getType() == TemporaryObject::Type::Rvalue &&
				getReferClass(v0->getRef()) == TemporaryTuple::getClassStatic());
		bool v1IsTuple = (getReferClass(v1->getRef()) == Tuple::getClassStatic());

		if (!v0IsTuple && v1IsTuple) {
			auto& tuple = v1->getRef().deref<Tuple>();
			if (tuple.tupleSize() != 1) {
				errorAtNode(*this, ErrorLevel::Error, node, "left side is not tuple even through value of right side is tuple", {});
				throw RuntimeException(StringId::UnsupportedOperationException);
			}
			v1->getRef().set(tuple.ref(0));
			v1IsTuple = false;
		}

		if (v0IsTuple) {
			if (!v1IsTuple) {
				errorAtNode(*this, ErrorLevel::Error, node, "right side is not tuple", {});
				throw RuntimeException(StringId::UnsupportedOperationException);
			}

			std::vector<TupleAssignmentMap::Element> map;
			v0->getRef().deref<TemporaryTuple>().toArgumentMatcher().mapReturns(v1->getRef().deref<Tuple>(),
					[&](size_t destIndex, const ArgumentDef& arg, size_t srcIndex) {
						map.emplace_back(destIndex, srcIndex, arg.type);

					}, [&](size_t destIndex, const ArgumentDef& arg, std::vector<size_t> srcIndexes) {
						map.emplace_back(destIndex, std::move(srcIndexes), arg.type);

					}, [&](const std::vector<size_t>& destIndexes) {
						std::vector<size_t> empty;
						for (size_t destIndex : destIndexes)
							map.emplace_back(destIndex, empty, ArgumentDef::Type::List);
					});

			f.subStack.push_back(f.values.size());
			f.pushTemporary()->setRvalue().allocate<TupleAssignmentMap>(std::move(map));
			nodePhase = phaseTuple;
			return true;
		}

		v0->addAssignment(node, {StringId::Invalid, getReferClass(v1->getRef())});
		nodePhase++;
		CHATRA_FALLTHROUGH;
	}

	case assignmentOperatorProcessPhase + 1:
		if (evaluateAndAllocateForAssignment(node->subNodes[0].get(), *(f.values.end() - 2)) != EvaluateValueResult::Next)
			return false;
		CHATRA_FALLTHROUGH;

	case assignmentOperatorProcessPhase + 2: {
		auto* v0 = *(f.values.end() - 2);
		switch (v0->getType()) {
		case TemporaryObject::Type::ScopeRef:
		case TemporaryObject::Type::ObjectRef:
			nodePhase = phaseReference;
			return true;

		case TemporaryObject::Type::FrameMethod:
		case TemporaryObject::Type::ObjectMethod:
			if (v0->getSetMethod() != nullptr) {
				nodePhase = phaseMethod;
				return true;
			}
			CHATRA_FALLTHROUGH;

		default:
			errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "expression is not assignable", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
	}

	case phaseReference: { // Reference; e.g. "a = 1", "b.c = 2"
		auto* v0 = *(f.values.end() - 2);
		auto* v1 = *(f.values.end() - 1);
		if (!lockReference(v0))
			return false;
		auto ref = v0->getRef();
		if (ref.isConst()) {
			errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "cannot modify constant reference", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
		if (v0->hasArguments() && getReferClass(ref) == FunctionObject::getClassStatic()) {
			nodePhase = phaseFunctionObject;
			return true;
		}

		ref.set(v1->getRef());
		f.pop();
		f.stack.pop_back();
		return true;
	}

	case phaseMethod: {  // Method; e.g. "a.b(...) = 1" where a is an instance of some class and its class has a method "def b(...).set(r)"
		f.stack.pop_back();
		methodCall(true);
		return false;
	}

	case phaseFunctionObject: {
		f.stack.pop_back();
		methodCallViaFunctionObject(true);
		return false;
	}

	default: {
		if (nodePhase >= phaseTuple) {  // Tuple; e.g. "a, b = foo()"
			auto& tmp = f.values[f.subStack.back() - 2]->getRef().deref<TemporaryTuple>();
			auto& tuple = f.values[f.subStack.back() - 1]->getRef().deref<Tuple>();
			auto& map = f.values[f.subStack.back()]->getRef().deref<TupleAssignmentMap>();

			constexpr size_t phasesPerElem = 1U << 2U;  // = 4
			for (;;) {
				size_t phase = nodePhase - phaseTuple;
				size_t position = phase / phasesPerElem;
				size_t subPhase = phase % phasesPerElem;

				switch (subPhase) {
				case 0: {
					if (map.map.size() <= position) {
						f.popTemporaryTuple();
						f.pop();
						f.pop();
						f.pop();
						f.pushTemporary()->setRvalue().setNull();
						f.stack.pop_back();
						f.subStack.pop_back();
						return true;
					}
					auto& e = map.map[position];
					tmp.extract(e.destIndex);

					const Class* cl;
					switch (e.type) {
					case ArgumentDef::Type::ListVarArg:  cl = Array::getClassStatic();  break;
					case ArgumentDef::Type::DictVarArg:  cl = Dict::getClassStatic();  break;
					default:  cl = (e.sourceIndexes.empty() ? nullptr : getReferClass(tuple.ref(e.sourceIndexes[0])));  break;
					}
					if (cl != nullptr)
						f.values.back()->addAssignment(node, {StringId::Invalid, cl});
					nodePhase++;
					CHATRA_FALLTHROUGH;
				}

				case 1:
					if (evaluateAndAllocateForAssignment(node->subNodes[0].get(), f.values.back()) != EvaluateValueResult::Next)
						return false;
					CHATRA_FALLTHROUGH;

				case 2: {
					auto* v0 = f.values.back();
					switch (v0->getType()) {
					case TemporaryObject::Type::ScopeRef:
					case TemporaryObject::Type::ObjectRef:
						break;

					case TemporaryObject::Type::FrameMethod:
					case TemporaryObject::Type::ObjectMethod:
						if (v0->getSetMethod() != nullptr)
							break;
						CHATRA_FALLTHROUGH;

					default:
						errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "expression is not assignable", {});
						throw RuntimeException(StringId::UnsupportedOperationException);
					}
					nodePhase++;
					CHATRA_FALLTHROUGH;
				}

				default: {
					auto& e = map.map[position];
					auto srcRef = f.pushTemporary()->setRvalue();
					switch (e.type) {
					case ArgumentDef::Type::ListVarArg: {
						auto& array = srcRef.allocate<Array>();
						for (size_t sourceIndex : e.sourceIndexes)
							array.add(tuple.ref(sourceIndex));
						break;
					}

					case ArgumentDef::Type::DictVarArg: {
						auto& dict = srcRef.allocate<Dict>();
						for (size_t sourceIndex : e.sourceIndexes) {
							auto& key = tuple.key(sourceIndex);
							dict.add(key.sid == StringId::Invalid ? key.str : sTable->ref(key.sid),
									tuple.ref(sourceIndex));
						}
						break;
					}

					default:
						if (e.sourceIndexes.empty())
							srcRef.setNull();
						else
							srcRef.set(tuple.ref(e.sourceIndexes[0]));
						break;
					}

					auto* v0 = *(f.values.end() - 2);
					if (v0->hasRef()) {
						if (!lockReference(v0))
							return false;
						auto ref = v0->getRef();
						if (ref.isConst()) {
							errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "cannot modify constant reference", {});
							throw RuntimeException(StringId::UnsupportedOperationException);
						}
						if (v0->hasArguments() && getReferClass(ref) == FunctionObject::getClassStatic()) {
							nodePhase = phaseTuple + (position + 1) * phasesPerElem;
							methodCallViaFunctionObject(true);
							return false;
						}

						ref.set(srcRef);
						f.pop();
						f.pop();
						nodePhase = phaseTuple + (position + 1) * phasesPerElem;
					}
					else {
						nodePhase = phaseTuple + (position + 1) * phasesPerElem;
						methodCall(true);
						return false;
					}
				}
				}
			}
		}
		throw InternalError();
	}
	}
}